

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

AsmJsModuleInfo * __thiscall Js::FunctionBody::AllocateAsmJsModuleInfo(FunctionBody *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  AsmJsModuleInfo *pAVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pAVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                     ((FunctionProxy *)this);
  if (pAVar3 != (AsmJsModuleInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1996,"(!this->GetAsmJsModuleInfo())",
                                "!this->GetAsmJsModuleInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  local_40 = (undefined1  [8])&AsmJsModuleInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1998;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_40);
  pAVar3 = (AsmJsModuleInfo *)new<Memory::Recycler>(0xb0,alloc,0x37a1d4);
  pAVar3->mRecycler = this_00;
  pAVar3->mArgInCount = 0;
  pAVar3->mVarCount = 0;
  pAVar3->mVarImportCount = 0;
  pAVar3->mFunctionImportCount = 0;
  pAVar3->mFunctionCount = 0;
  pAVar3->mFunctionTableCount = 0;
  (pAVar3->mExports).ptr = (PropertyIdArray *)0x0;
  (pAVar3->mExportsFunctionLocation).ptr = (uint *)0x0;
  (pAVar3->mFunctionTables).ptr = (ModuleFunctionTable *)0x0;
  (pAVar3->mVars).ptr = (ModuleVar *)0x0;
  (pAVar3->mVarImports).ptr = (ModuleVarImport *)0x0;
  (pAVar3->mFunctionImports).ptr = (ModuleFunctionImport *)0x0;
  (pAVar3->mFunctions).ptr = (ModuleFunction *)0x0;
  (pAVar3->mSlotMap).ptr =
       (BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (pAVar3->mAsmMathBuiltinUsed).data[0].word = 0;
  *(undefined8 *)((long)&(pAVar3->mAsmMathBuiltinUsed).data[0].word + 5) = 0;
  *(undefined8 *)((long)&(pAVar3->mAsmArrayBuiltinUsed).data[0].word + 5) = 0;
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
            ((FunctionProxy *)this,pAVar3);
  pAVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)3,Js::AsmJsModuleInfo*>
                     ((FunctionProxy *)this);
  return pAVar3;
}

Assistant:

AsmJsModuleInfo* FunctionBody::AllocateAsmJsModuleInfo()
    {
        Assert( !this->GetAsmJsModuleInfo() );
        Recycler* rec = m_scriptContext->GetRecycler();
        this->SetAuxPtr<AuxPointerType::AsmJsModuleInfo>(RecyclerNew(rec, AsmJsModuleInfo, rec));
        return this->GetAsmJsModuleInfo();
    }